

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::alignPTS(TSMuxer *this,TSMuxer *otherMuxer)

{
  long lVar1;
  pointer plVar2;
  bool bVar3;
  reference plVar4;
  pointer local_68;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  pointer local_20;
  int64_t minPTS;
  TSMuxer *otherMuxer_local;
  TSMuxer *this_local;
  
  minPTS = (int64_t)otherMuxer;
  otherMuxer_local = this;
  bVar3 = std::vector<long,_std::allocator<long>_>::empty(&this->m_lastPts);
  if (!bVar3) {
    bVar3 = std::vector<long,_std::allocator<long>_>::empty
                      ((vector<long,_std::allocator<long>_> *)(minPTS + 0xe8));
    if (!bVar3) {
      std::vector<long,_std::allocator<long>_>::rbegin
                ((vector<long,_std::allocator<long>_> *)(local_30 + 8));
      plVar4 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                            *)(local_30 + 8));
      lVar1 = *plVar4;
      std::vector<long,_std::allocator<long>_>::rbegin
                ((vector<long,_std::allocator<long>_> *)local_30);
      plVar4 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                            *)local_30);
      if (*plVar4 < lVar1) {
        std::vector<long,_std::allocator<long>_>::rbegin
                  ((vector<long,_std::allocator<long>_> *)(local_40 + 8));
        plVar4 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                              *)(local_40 + 8));
        local_68 = (pointer)*plVar4;
      }
      else {
        std::vector<long,_std::allocator<long>_>::rbegin
                  ((vector<long,_std::allocator<long>_> *)local_40);
        plVar4 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                              *)local_40);
        local_68 = (pointer)*plVar4;
      }
      local_20 = local_68;
      std::vector<long,_std::allocator<long>_>::rbegin
                ((vector<long,_std::allocator<long>_> *)(local_50 + 8));
      plVar4 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                            *)(local_50 + 8));
      plVar2 = local_20;
      *plVar4 = (long)local_68;
      std::vector<long,_std::allocator<long>_>::rbegin
                ((vector<long,_std::allocator<long>_> *)local_50);
      plVar4 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                            *)local_50);
      *plVar4 = (long)plVar2;
    }
  }
  return;
}

Assistant:

void TSMuxer::alignPTS(TSMuxer* otherMuxer)
{
    if (!m_lastPts.empty() && !otherMuxer->m_lastPts.empty())
    {
        const int64_t minPTS = FFMIN(*m_lastPts.rbegin(), *otherMuxer->m_lastPts.rbegin());
        *m_lastPts.rbegin() = minPTS;
        *otherMuxer->m_lastPts.rbegin() = minPTS;
    }
}